

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
         *this,size_t i)

{
  float fVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  byte bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  ulong uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar34 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined4 uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined4 uVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar70 [64];
  undefined1 auVar45 [32];
  
  pBVar3 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.vertices.
           items;
  uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar4 = (pBVar3->super_RawBufferView).ptr_ofs;
  sVar5 = (pBVar3->super_RawBufferView).stride;
  auVar34 = *(undefined1 (*) [16])(pcVar4 + uVar2 * sVar5);
  lVar21 = (uVar2 + 1) * sVar5;
  auVar33 = *(undefined1 (*) [16])(pcVar4 + lVar21);
  lVar22 = (uVar2 + 2) * sVar5;
  auVar32 = *(undefined1 (*) [16])(pcVar4 + lVar22);
  lVar23 = (uVar2 + 3) * sVar5;
  auVar31 = *(undefined1 (*) [16])(pcVar4 + lVar23);
  fVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar9 = fVar1 * *(float *)(pcVar4 + uVar2 * sVar5 + 0xc);
  fVar10 = fVar1 * *(float *)(pcVar4 + lVar21 + 0xc);
  fVar11 = fVar1 * *(float *)(pcVar4 + lVar22 + 0xc);
  auVar24 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar4 + lVar23 + 0xc)));
  uVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
          tessellationRate;
  uVar19 = (ulong)uVar2;
  uVar65 = auVar33._0_4_;
  uVar58 = auVar34._0_4_;
  if (uVar19 == 4) {
    auVar25 = vbroadcastss_avx512vl(auVar24);
    auVar24 = vblendps_avx(auVar31,auVar25,8);
    auVar61._4_4_ = fVar11;
    auVar61._0_4_ = fVar11;
    auVar61._8_4_ = fVar11;
    auVar61._12_4_ = fVar11;
    auVar8 = vblendps_avx(auVar32,auVar61,8);
    auVar56._4_4_ = fVar10;
    auVar56._0_4_ = fVar10;
    auVar56._8_4_ = fVar10;
    auVar56._12_4_ = fVar10;
    auVar55 = vblendps_avx(auVar33,auVar56,8);
    auVar64._4_4_ = uVar58;
    auVar64._0_4_ = uVar58;
    auVar64._8_4_ = uVar58;
    auVar64._12_4_ = uVar58;
    auVar12 = vshufps_avx(auVar34,auVar34,0x55);
    auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
    auVar59._4_4_ = fVar9;
    auVar59._0_4_ = fVar9;
    auVar59._8_4_ = fVar9;
    auVar59._12_4_ = fVar9;
    auVar68._4_4_ = uVar65;
    auVar68._0_4_ = uVar65;
    auVar68._8_4_ = uVar65;
    auVar68._12_4_ = uVar65;
    auVar26 = vshufps_avx512vl(auVar33,auVar33,0x55);
    auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
    auVar27 = vbroadcastss_avx512vl(auVar32);
    auVar28 = vshufps_avx512vl(auVar32,auVar32,0x55);
    auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar29 = vbroadcastss_avx512vl(auVar31);
    auVar30 = vshufps_avx512vl(auVar31,auVar31,0x55);
    auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
    auVar29 = vmulps_avx512vl(auVar29,bspline_basis0._3740_16_);
    auVar30 = vmulps_avx512vl(auVar30,bspline_basis0._3740_16_);
    auVar31 = vmulps_avx512vl(auVar31,bspline_basis0._3740_16_);
    auVar25 = vmulps_avx512vl(auVar25,bspline_basis0._3740_16_);
    auVar27 = vfmadd231ps_avx512vl(auVar29,bspline_basis0._2584_16_,auVar27);
    auVar28 = vfmadd231ps_avx512vl(auVar30,bspline_basis0._2584_16_,auVar28);
    auVar32 = vfmadd231ps_avx512vl(auVar31,bspline_basis0._2584_16_,auVar32);
    auVar31 = vfmadd231ps_avx512vl(auVar25,bspline_basis0._2584_16_,auVar61);
    auVar25 = vfmadd231ps_avx512vl(auVar27,bspline_basis0._1428_16_,auVar68);
    auVar26 = vfmadd231ps_avx512vl(auVar28,bspline_basis0._1428_16_,auVar26);
    auVar33 = vfmadd231ps_fma(auVar32,bspline_basis0._1428_16_,auVar33);
    auVar32 = vfmadd231ps_fma(auVar31,bspline_basis0._1428_16_,auVar56);
    auVar27 = vfmadd231ps_avx512vl(auVar25,bspline_basis0._272_16_,auVar64);
    auVar26 = vfmadd231ps_avx512vl(auVar26,bspline_basis0._272_16_,auVar12);
    auVar12 = vfmadd231ps_fma(auVar33,bspline_basis0._272_16_,auVar34);
    auVar25 = vfmadd231ps_fma(auVar32,bspline_basis0._272_16_,auVar59);
    auVar28 = vshufps_avx512vl(auVar27,auVar27,0xb1);
    auVar33 = vminps_avx512vl(auVar28,auVar27);
    auVar34 = vshufpd_avx(auVar33,auVar33,1);
    auVar34 = vminps_avx(auVar34,auVar33);
    auVar29 = vshufps_avx512vl(auVar26,auVar26,0xb1);
    auVar32 = vminps_avx512vl(auVar29,auVar26);
    auVar33 = vshufpd_avx(auVar32,auVar32,1);
    auVar33 = vminps_avx(auVar33,auVar32);
    auVar34 = vinsertps_avx(auVar34,auVar33,0x1c);
    auVar31 = vshufps_avx(auVar12,auVar12,0xb1);
    auVar33 = vminps_avx(auVar31,auVar12);
    auVar32 = vshufpd_avx(auVar33,auVar33,1);
    auVar33 = vminps_avx(auVar32,auVar33);
    auVar34 = vinsertps_avx(auVar34,auVar33,0x20);
    auVar32 = vmaxps_avx512vl(auVar28,auVar27);
    auVar33 = vshufpd_avx(auVar32,auVar32,1);
    auVar33 = vmaxps_avx(auVar33,auVar32);
    auVar26 = vmaxps_avx512vl(auVar29,auVar26);
    auVar32 = vshufpd_avx(auVar26,auVar26,1);
    auVar32 = vmaxps_avx(auVar32,auVar26);
    auVar33 = vinsertps_avx(auVar33,auVar32,0x1c);
    auVar32 = vmaxps_avx(auVar31,auVar12);
    auVar31 = vshufpd_avx(auVar32,auVar32,1);
    auVar32 = vmaxps_avx(auVar31,auVar32);
    auVar33 = vinsertps_avx(auVar33,auVar32,0x20);
    auVar12._8_4_ = 0x7fffffff;
    auVar12._0_8_ = 0x7fffffff7fffffff;
    auVar12._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx512vl(auVar25,auVar12);
    auVar31 = vprolq_avx512vl(auVar32,0x20);
    auVar32 = vmaxps_avx(auVar31,auVar32);
    uVar58 = auVar32._0_4_;
    auVar26._4_4_ = uVar58;
    auVar26._0_4_ = uVar58;
    auVar26._8_4_ = uVar58;
    auVar26._12_4_ = uVar58;
    auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar32 = vmaxps_avx(auVar32,auVar26);
    auVar27._8_4_ = 0x3e2aaaab;
    auVar27._0_8_ = 0x3e2aaaab3e2aaaab;
    auVar27._12_4_ = 0x3e2aaaab;
    auVar25._0_4_ = auVar24._0_4_ * 0.16666667;
    auVar25._4_4_ = auVar24._4_4_ * 0.16666667;
    auVar25._8_4_ = auVar24._8_4_ * 0.16666667;
    auVar25._12_4_ = auVar24._12_4_ * 0.16666667;
    auVar24._8_4_ = 0x3f2aaaab;
    auVar24._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar24._12_4_ = 0x3f2aaaab;
    auVar31 = vfmadd231ps_avx512vl(auVar25,auVar8,auVar24);
    auVar31 = vfmadd231ps_fma(auVar31,auVar27,auVar55);
    auVar34 = vminps_avx(auVar34,auVar31);
    auVar33 = vmaxps_avx(auVar33,auVar31);
    auVar31 = vshufps_avx(auVar31,auVar31,0xff);
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar31 = vandps_avx512vl(auVar31,auVar8);
    auVar31 = vmaxps_avx(auVar32,auVar31);
    auVar34 = vsubps_avx(auVar34,auVar31);
    auVar32._0_4_ = auVar33._0_4_ + auVar31._0_4_;
    auVar32._4_4_ = auVar33._4_4_ + auVar31._4_4_;
    auVar32._8_4_ = auVar33._8_4_ + auVar31._8_4_;
    auVar32._12_4_ = auVar33._12_4_ + auVar31._12_4_;
  }
  else {
    if ((int)uVar2 < 0) {
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar34 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      auVar48 = ZEXT1632(auVar34);
      auVar50 = auVar49;
      auVar36 = auVar49;
      auVar46 = auVar51;
      auVar47 = auVar51;
    }
    else {
      auVar35 = vpbroadcastd_avx512vl();
      auVar69._8_4_ = 1;
      auVar69._0_8_ = 0x100000001;
      auVar69._12_4_ = 1;
      auVar69._16_4_ = 1;
      auVar69._20_4_ = 1;
      auVar69._24_4_ = 1;
      auVar69._28_4_ = 1;
      auVar54 = vpermps_avx2(auVar69,ZEXT1632(auVar34));
      auVar36 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar37 = vpermps_avx512vl(auVar36,ZEXT1632(auVar34));
      auVar57._4_4_ = fVar9;
      auVar57._0_4_ = fVar9;
      auVar57._8_4_ = fVar9;
      auVar57._12_4_ = fVar9;
      auVar57._16_4_ = fVar9;
      auVar57._20_4_ = fVar9;
      auVar57._24_4_ = fVar9;
      auVar57._28_4_ = fVar9;
      auVar60._4_4_ = uVar65;
      auVar60._0_4_ = uVar65;
      auVar60._8_4_ = uVar65;
      auVar60._12_4_ = uVar65;
      auVar60._16_4_ = uVar65;
      auVar60._20_4_ = uVar65;
      auVar60._24_4_ = uVar65;
      auVar60._28_4_ = uVar65;
      auVar14 = vpermps_avx2(auVar69,ZEXT1632(auVar33));
      auVar38 = vpermps_avx512vl(auVar36,ZEXT1632(auVar33));
      auVar62._4_4_ = fVar10;
      auVar62._0_4_ = fVar10;
      auVar62._8_4_ = fVar10;
      auVar62._12_4_ = fVar10;
      auVar62._16_4_ = fVar10;
      auVar62._20_4_ = fVar10;
      auVar62._24_4_ = fVar10;
      auVar62._28_4_ = fVar10;
      uVar65 = auVar32._0_4_;
      auVar63._4_4_ = uVar65;
      auVar63._0_4_ = uVar65;
      auVar63._8_4_ = uVar65;
      auVar63._12_4_ = uVar65;
      auVar63._16_4_ = uVar65;
      auVar63._20_4_ = uVar65;
      auVar63._24_4_ = uVar65;
      auVar63._28_4_ = uVar65;
      auVar15 = vpermps_avx2(auVar69,ZEXT1632(auVar32));
      auVar39 = vpermps_avx512vl(auVar36,ZEXT1632(auVar32));
      auVar66._4_4_ = fVar11;
      auVar66._0_4_ = fVar11;
      auVar66._8_4_ = fVar11;
      auVar66._12_4_ = fVar11;
      auVar66._16_4_ = fVar11;
      auVar66._20_4_ = fVar11;
      auVar66._24_4_ = fVar11;
      auVar66._28_4_ = fVar11;
      uVar65 = auVar31._0_4_;
      auVar67._4_4_ = uVar65;
      auVar67._0_4_ = uVar65;
      auVar67._8_4_ = uVar65;
      auVar67._12_4_ = uVar65;
      auVar67._16_4_ = uVar65;
      auVar67._20_4_ = uVar65;
      auVar67._24_4_ = uVar65;
      auVar67._28_4_ = uVar65;
      auVar69 = vpermps_avx2(auVar69,ZEXT1632(auVar31));
      auVar40 = vpermps_avx512vl(auVar36,ZEXT1632(auVar31));
      auVar41 = vbroadcastss_avx512vl(auVar24);
      lVar21 = uVar19 * 0x44;
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar34 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar70 = ZEXT1664(auVar34);
      uVar20 = 0;
      auVar53 = auVar43;
      auVar18 = auVar42;
      auVar44 = auVar42;
      auVar45 = auVar43;
      do {
        auVar36 = vpbroadcastd_avx512vl();
        auVar46 = vpord_avx512vl(auVar36,_DAT_0205a920);
        auVar36 = *(undefined1 (*) [32])(bspline_basis0 + uVar20 * 4 + lVar21);
        auVar51 = *(undefined1 (*) [32])(lVar21 + 0x222bfac + uVar20 * 4);
        auVar50 = *(undefined1 (*) [32])(lVar21 + 0x222c430 + uVar20 * 4);
        uVar16 = vpcmpgtd_avx512vl(auVar46,auVar35);
        auVar46 = *(undefined1 (*) [32])(lVar21 + 0x222c8b4 + uVar20 * 4);
        auVar47 = vmulps_avx512vl(auVar67,auVar46);
        auVar48 = vmulps_avx512vl(auVar69,auVar46);
        auVar49 = vmulps_avx512vl(auVar40,auVar46);
        auVar46 = vmulps_avx512vl(auVar41,auVar46);
        auVar47 = vfmadd231ps_avx512vl(auVar47,auVar50,auVar63);
        auVar48 = vfmadd231ps_avx512vl(auVar48,auVar50,auVar15);
        auVar49 = vfmadd231ps_avx512vl(auVar49,auVar50,auVar39);
        auVar50 = vfmadd231ps_avx512vl(auVar46,auVar66,auVar50);
        auVar46 = vfmadd231ps_avx512vl(auVar47,auVar51,auVar60);
        auVar47 = vfmadd231ps_avx512vl(auVar48,auVar51,auVar14);
        auVar48 = vfmadd231ps_avx512vl(auVar49,auVar51,auVar38);
        auVar51 = vfmadd231ps_avx512vl(auVar50,auVar62,auVar51);
        auVar52._4_4_ = uVar58;
        auVar52._0_4_ = uVar58;
        auVar52._8_4_ = uVar58;
        auVar52._12_4_ = uVar58;
        auVar52._16_4_ = uVar58;
        auVar52._20_4_ = uVar58;
        auVar52._24_4_ = uVar58;
        auVar52._28_4_ = uVar58;
        auVar50 = vfmadd231ps_avx512vl(auVar46,auVar36,auVar52);
        auVar49 = vfmadd231ps_avx512vl(auVar47,auVar36,auVar54);
        auVar48 = vfmadd231ps_avx512vl(auVar48,auVar36,auVar37);
        auVar52 = vfmadd231ps_avx512vl(auVar51,auVar57,auVar36);
        auVar17._8_4_ = 0x7fffffff;
        auVar17._0_8_ = 0x7fffffff7fffffff;
        auVar17._12_4_ = 0x7fffffff;
        auVar17._16_4_ = 0x7fffffff;
        auVar17._20_4_ = 0x7fffffff;
        auVar17._24_4_ = 0x7fffffff;
        auVar17._28_4_ = 0x7fffffff;
        vandps_avx512vl(auVar52,auVar17);
        auVar36 = vminps_avx512vl(auVar45,auVar50);
        bVar6 = (byte)uVar16;
        auVar46._0_4_ = (uint)(bVar6 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar36._0_4_
        ;
        bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar46._4_4_ = (uint)bVar7 * auVar45._4_4_ | (uint)!bVar7 * auVar36._4_4_;
        bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar46._8_4_ = (uint)bVar7 * auVar45._8_4_ | (uint)!bVar7 * auVar36._8_4_;
        bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar46._12_4_ = (uint)bVar7 * auVar45._12_4_ | (uint)!bVar7 * auVar36._12_4_;
        bVar7 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar46._16_4_ = (uint)bVar7 * auVar45._16_4_ | (uint)!bVar7 * auVar36._16_4_;
        bVar7 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar46._20_4_ = (uint)bVar7 * auVar45._20_4_ | (uint)!bVar7 * auVar36._20_4_;
        bVar7 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar46._24_4_ = (uint)bVar7 * auVar45._24_4_ | (uint)!bVar7 * auVar36._24_4_;
        bVar7 = SUB81(uVar16 >> 7,0);
        auVar46._28_4_ = (uint)bVar7 * auVar45._28_4_ | (uint)!bVar7 * auVar36._28_4_;
        auVar36 = vminps_avx512vl(auVar53,auVar49);
        auVar51._0_4_ = (uint)(bVar6 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar36._0_4_
        ;
        bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar7 * auVar53._4_4_ | (uint)!bVar7 * auVar36._4_4_;
        bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar7 * auVar53._8_4_ | (uint)!bVar7 * auVar36._8_4_;
        bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar7 * auVar53._12_4_ | (uint)!bVar7 * auVar36._12_4_;
        bVar7 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar7 * auVar53._16_4_ | (uint)!bVar7 * auVar36._16_4_;
        bVar7 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar7 * auVar53._20_4_ | (uint)!bVar7 * auVar36._20_4_;
        bVar7 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar7 * auVar53._24_4_ | (uint)!bVar7 * auVar36._24_4_;
        bVar7 = SUB81(uVar16 >> 7,0);
        auVar51._28_4_ = (uint)bVar7 * auVar53._28_4_ | (uint)!bVar7 * auVar36._28_4_;
        auVar36 = vminps_avx512vl(auVar43,auVar48);
        auVar47._0_4_ = (uint)(bVar6 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar36._0_4_
        ;
        bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar47._4_4_ = (uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * auVar36._4_4_;
        bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar47._8_4_ = (uint)bVar7 * auVar43._8_4_ | (uint)!bVar7 * auVar36._8_4_;
        bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar47._12_4_ = (uint)bVar7 * auVar43._12_4_ | (uint)!bVar7 * auVar36._12_4_;
        bVar7 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar47._16_4_ = (uint)bVar7 * auVar43._16_4_ | (uint)!bVar7 * auVar36._16_4_;
        bVar7 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar47._20_4_ = (uint)bVar7 * auVar43._20_4_ | (uint)!bVar7 * auVar36._20_4_;
        bVar7 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar47._24_4_ = (uint)bVar7 * auVar43._24_4_ | (uint)!bVar7 * auVar36._24_4_;
        bVar7 = SUB81(uVar16 >> 7,0);
        auVar47._28_4_ = (uint)bVar7 * auVar43._28_4_ | (uint)!bVar7 * auVar36._28_4_;
        auVar36 = vmaxps_avx512vl(auVar44,auVar50);
        auVar50._0_4_ = (uint)(bVar6 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar36._0_4_
        ;
        bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar7 * auVar44._4_4_ | (uint)!bVar7 * auVar36._4_4_;
        bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar7 * auVar44._8_4_ | (uint)!bVar7 * auVar36._8_4_;
        bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar7 * auVar44._12_4_ | (uint)!bVar7 * auVar36._12_4_;
        bVar7 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar50._16_4_ = (uint)bVar7 * auVar44._16_4_ | (uint)!bVar7 * auVar36._16_4_;
        bVar7 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar50._20_4_ = (uint)bVar7 * auVar44._20_4_ | (uint)!bVar7 * auVar36._20_4_;
        bVar7 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar50._24_4_ = (uint)bVar7 * auVar44._24_4_ | (uint)!bVar7 * auVar36._24_4_;
        bVar7 = SUB81(uVar16 >> 7,0);
        auVar50._28_4_ = (uint)bVar7 * auVar44._28_4_ | (uint)!bVar7 * auVar36._28_4_;
        auVar49 = vmaxps_avx512vl(auVar18,auVar49);
        auVar36._0_4_ = (uint)(bVar6 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar49._0_4_
        ;
        bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar36._4_4_ = (uint)bVar7 * auVar18._4_4_ | (uint)!bVar7 * auVar49._4_4_;
        bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar36._8_4_ = (uint)bVar7 * auVar18._8_4_ | (uint)!bVar7 * auVar49._8_4_;
        bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar36._12_4_ = (uint)bVar7 * auVar18._12_4_ | (uint)!bVar7 * auVar49._12_4_;
        bVar7 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar36._16_4_ = (uint)bVar7 * auVar18._16_4_ | (uint)!bVar7 * auVar49._16_4_;
        bVar7 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar36._20_4_ = (uint)bVar7 * auVar18._20_4_ | (uint)!bVar7 * auVar49._20_4_;
        bVar7 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar36._24_4_ = (uint)bVar7 * auVar18._24_4_ | (uint)!bVar7 * auVar49._24_4_;
        bVar7 = SUB81(uVar16 >> 7,0);
        auVar36._28_4_ = (uint)bVar7 * auVar18._28_4_ | (uint)!bVar7 * auVar49._28_4_;
        auVar48 = vmaxps_avx512vl(auVar42,auVar48);
        auVar49._0_4_ = (uint)(bVar6 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar48._0_4_
        ;
        bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar49._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar48._4_4_;
        bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar49._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar48._8_4_;
        bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar49._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar48._12_4_;
        bVar7 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar49._16_4_ = (uint)bVar7 * auVar42._16_4_ | (uint)!bVar7 * auVar48._16_4_;
        bVar7 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar49._20_4_ = (uint)bVar7 * auVar42._20_4_ | (uint)!bVar7 * auVar48._20_4_;
        bVar7 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar49._24_4_ = (uint)bVar7 * auVar42._24_4_ | (uint)!bVar7 * auVar48._24_4_;
        bVar7 = SUB81(uVar16 >> 7,0);
        auVar49._28_4_ = (uint)bVar7 * auVar42._28_4_ | (uint)!bVar7 * auVar48._28_4_;
        auVar53 = vmaxps_avx512vl(auVar70._0_32_,auVar52);
        auVar48._0_4_ = (uint)(bVar6 & 1) * auVar70._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar53._0_4_
        ;
        bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar7 * auVar70._4_4_ | (uint)!bVar7 * auVar53._4_4_;
        bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar7 * auVar70._8_4_ | (uint)!bVar7 * auVar53._8_4_;
        bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar7 * auVar70._12_4_ | (uint)!bVar7 * auVar53._12_4_;
        bVar7 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar48._16_4_ = (uint)bVar7 * auVar70._16_4_ | (uint)!bVar7 * auVar53._16_4_;
        bVar7 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar48._20_4_ = (uint)bVar7 * auVar70._20_4_ | (uint)!bVar7 * auVar53._20_4_;
        bVar7 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar48._24_4_ = (uint)bVar7 * auVar70._24_4_ | (uint)!bVar7 * auVar53._24_4_;
        bVar7 = SUB81(uVar16 >> 7,0);
        auVar48._28_4_ = (uint)bVar7 * auVar70._28_4_ | (uint)!bVar7 * auVar53._28_4_;
        uVar20 = uVar20 + 8;
        auVar70 = ZEXT3264(auVar48);
        auVar43 = auVar47;
        auVar42 = auVar49;
        auVar53 = auVar51;
        auVar18 = auVar36;
        auVar44 = auVar50;
        auVar45 = auVar46;
      } while (uVar20 <= uVar19);
    }
    auVar54 = vshufps_avx512vl(auVar46,auVar46,0xb1);
    auVar54 = vminps_avx512vl(auVar46,auVar54);
    auVar46 = vshufpd_avx(auVar54,auVar54,5);
    auVar46 = vminps_avx(auVar54,auVar46);
    auVar34 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
    auVar46 = vshufps_avx512vl(auVar51,auVar51,0xb1);
    auVar46 = vminps_avx512vl(auVar51,auVar46);
    auVar51 = vshufpd_avx(auVar46,auVar46,5);
    auVar51 = vminps_avx(auVar46,auVar51);
    auVar33 = vminps_avx(auVar51._0_16_,auVar51._16_16_);
    auVar33 = vunpcklps_avx(auVar34,auVar33);
    auVar51 = vshufps_avx512vl(auVar47,auVar47,0xb1);
    auVar46 = vminps_avx512vl(auVar47,auVar51);
    auVar51 = vshufpd_avx(auVar46,auVar46,5);
    auVar51 = vminps_avx(auVar46,auVar51);
    auVar34 = vminps_avx(auVar51._0_16_,auVar51._16_16_);
    auVar34 = vinsertps_avx(auVar33,auVar34,0x28);
    auVar51 = vshufps_avx512vl(auVar50,auVar50,0xb1);
    auVar50 = vmaxps_avx512vl(auVar50,auVar51);
    auVar51 = vshufpd_avx(auVar50,auVar50,5);
    auVar51 = vmaxps_avx(auVar50,auVar51);
    auVar33 = vmaxps_avx(auVar51._0_16_,auVar51._16_16_);
    auVar51 = vshufps_avx512vl(auVar36,auVar36,0xb1);
    auVar51 = vmaxps_avx512vl(auVar36,auVar51);
    auVar36 = vshufpd_avx(auVar51,auVar51,5);
    auVar36 = vmaxps_avx(auVar51,auVar36);
    auVar32 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
    auVar32 = vunpcklps_avx(auVar33,auVar32);
    auVar36 = vshufps_avx512vl(auVar49,auVar49,0xb1);
    auVar51 = vmaxps_avx512vl(auVar49,auVar36);
    auVar36 = vshufpd_avx(auVar51,auVar51,5);
    auVar36 = vmaxps_avx(auVar51,auVar36);
    auVar33 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
    auVar33 = vinsertps_avx(auVar32,auVar33,0x28);
    auVar36 = vshufps_avx512vl(auVar48,auVar48,0xb1);
    auVar51 = vmaxps_avx512vl(auVar48,auVar36);
    auVar36 = vshufpd_avx(auVar51,auVar51,5);
    auVar36 = vmaxps_avx(auVar51,auVar36);
    auVar32 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
    auVar31._0_4_ = auVar32._0_4_;
    auVar31._4_4_ = auVar31._0_4_;
    auVar31._8_4_ = auVar31._0_4_;
    auVar31._12_4_ = auVar31._0_4_;
    auVar34 = vsubps_avx(auVar34,auVar31);
    auVar32._0_4_ = auVar33._0_4_ + auVar31._0_4_;
    auVar32._4_4_ = auVar33._4_4_ + auVar31._0_4_;
    auVar32._8_4_ = auVar33._8_4_ + auVar31._0_4_;
    auVar32._12_4_ = auVar33._12_4_ + auVar31._0_4_;
  }
  auVar55._8_4_ = 0x7fffffff;
  auVar55._0_8_ = 0x7fffffff7fffffff;
  auVar55._12_4_ = 0x7fffffff;
  auVar33 = vandps_avx(auVar34,auVar55);
  auVar31 = vandps_avx(auVar32,auVar55);
  auVar33 = vmaxps_avx(auVar33,auVar31);
  auVar31 = vmovshdup_avx(auVar33);
  auVar31 = vmaxss_avx(auVar31,auVar33);
  auVar33 = vshufpd_avx(auVar33,auVar33,1);
  auVar33 = vmaxss_avx(auVar33,auVar31);
  fVar1 = auVar33._0_4_ * 4.7683716e-07;
  auVar33._4_4_ = fVar1;
  auVar33._0_4_ = fVar1;
  auVar33._8_4_ = fVar1;
  auVar33._12_4_ = fVar1;
  aVar13 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar34,auVar33);
  (__return_storage_ptr__->lower).field_0 = aVar13;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar32._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar32._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar32._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar32._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }